

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::show(Fl_File_Chooser *this)

{
  Fl_File_Chooser *this_local;
  
  Fl_Window::hotspot(&this->window->super_Fl_Window,(Fl_Widget *)this->fileList,0);
  (*(this->window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl::flush();
  fl_cursor(FL_CURSOR_WAIT);
  rescan_keep_filename(this);
  fl_cursor(FL_CURSOR_DEFAULT);
  Fl_Widget::take_focus((Fl_Widget *)this->fileName);
  return;
}

Assistant:

void Fl_File_Chooser::show()
{
  window->hotspot(fileList);
  window->show();
  Fl::flush();
  fl_cursor(FL_CURSOR_WAIT);
  rescan_keep_filename();
  fl_cursor(FL_CURSOR_DEFAULT);
  fileName->take_focus();
#ifdef WIN32
  showHiddenButton->hide();
#endif
}